

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

void __thiscall xe::TestCaseResultData::clear(TestCaseResultData *this)

{
  TestCaseResultData *this_local;
  
  this->m_statusCode = TESTSTATUSCODE_LAST;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_data);
  return;
}

Assistant:

void TestCaseResultData::clear (void)
{
	m_statusCode = TESTSTATUSCODE_LAST;
	m_statusDetails.clear();
	m_casePath.clear();
	m_data.clear();
}